

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O2

int __thiscall GEO::geofile::merge_points(geofile *this,geofile *secondary_file)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Rb_tree_color _Var3;
  _Rb_tree_iterator<std::pair<const_int,_GEO::point>_> _Var4;
  _Base_ptr p_Var5;
  _Self __tmp;
  _Self __tmp_1;
  pair<const_int,_GEO::point> local_b8;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> changes;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  if ((this->points_map)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    std::
    _Rb_tree<int,_std::pair<const_int,_GEO::point>,_std::_Select1st<std::pair<const_int,_GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
    ::operator=(&(this->points_map)._M_t,&(secondary_file->points_map)._M_t);
  }
  else {
    _Var2 = (secondary_file->points_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1].
            _M_color;
    _Var4 = std::prev<std::_Rb_tree_iterator<std::pair<int_const,GEO::point>>>
                      ((_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>)
                       &(this->points_map)._M_t._M_impl.super__Rb_tree_header,1);
    _Var3 = _Var4._M_node[1]._M_color;
    changes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &changes._M_t._M_impl.super__Rb_tree_header._M_header;
    changes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    changes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    changes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var1 = &(secondary_file->points_map)._M_t._M_impl.super__Rb_tree_header;
    changes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         changes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var5 = (secondary_file->points_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != p_Var1; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      local_b8.first = p_Var5[1]._M_color;
      local_b8._4_4_ = (_Var3 - _Var2) + 1 + local_b8.first;
      std::
      _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
      ::_M_insert_unique<std::pair<int_const,int>>
                ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                  *)&changes,(pair<const_int,_int> *)&local_b8);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::_Rb_tree(&local_60,&changes._M_t);
    adjust_points(this,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&local_60);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_60);
    for (p_Var5 = (secondary_file->points_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != p_Var1; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      local_b8.first = p_Var5[1]._M_color;
      local_b8.second.x = (double)p_Var5[1]._M_parent;
      local_b8.second.y = (double)p_Var5[1]._M_left;
      local_b8.second.z = (double)p_Var5[1]._M_right;
      local_b8.second.char_len = *(double *)(p_Var5 + 2);
      std::
      _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
      ::_M_insert_unique<std::pair<int_const,GEO::point>>
                ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
                  *)&this->points_map,&local_b8);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&changes._M_t);
  }
  return 0;
}

Assistant:

int GEO::geofile::merge_points(geofile &secondary_file)
{
    if (!points_map.empty())
    {
        int lowest_secondary    = secondary_file.points_map.begin()->first;
        int highest_primary     = std::prev(points_map.end())->first;
        int delta               = highest_primary - lowest_secondary + 1;
        std::map <int,int> changes;
        auto sec_point_map_end = secondary_file.points_map.end();
        for (   auto sec_point_map_it = secondary_file.points_map.begin();
                sec_point_map_it != sec_point_map_end;
                sec_point_map_it++)
        {
            changes.insert({ sec_point_map_it->first,
                            sec_point_map_it->first + delta});
        }
        adjust_points(changes);
        sec_point_map_end = secondary_file.points_map.end();
        for (   auto sec_point_map_it = secondary_file.points_map.begin();
                sec_point_map_it != sec_point_map_end;
                sec_point_map_it++)
        {
            points_map.insert({sec_point_map_it->first,sec_point_map_it->second});
        }
    }
    else
    {
        points_map = secondary_file.points_map;
    }
    return EXIT_SUCCESS;
}